

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestUTestMacro.cpp
# Opt level: O2

void failing_CHECK_EQUAL_WithActualBeingEvaluatesMultipleTimesWillGiveAWarning_(void)

{
  UtestShell *pUVar1;
  TestTerminator *pTVar2;
  char *pcVar3;
  char *pcVar4;
  SimpleString SStack_38;
  SimpleString local_28;
  
  if (countInCountingMethod == 0x3039) {
    countInCountingMethod = countInCountingMethod + 1;
    pUVar1 = UtestShell::getCurrent();
    pTVar2 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0xe])
              (pUVar1,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestUTestMacro.cpp"
               ,0x1d2,pTVar2);
  }
  else {
    countInCountingMethod = countInCountingMethod + 3;
    pUVar1 = UtestShell::getCurrent();
    (*pUVar1->_vptr_UtestShell[0x1c])
              (pUVar1,
               "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestUTestMacro.cpp"
               ,0x1d2);
    pUVar1 = UtestShell::getCurrent();
    StringFrom((int)&local_28);
    pcVar3 = SimpleString::asCharString(&local_28);
    countInCountingMethod = countInCountingMethod + 1;
    StringFrom((int)&SStack_38);
    pcVar4 = SimpleString::asCharString(&SStack_38);
    pTVar2 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0x16])
              (pUVar1,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestUTestMacro.cpp"
               ,0x1d2,pTVar2);
    SimpleString::~SimpleString(&SStack_38);
    SimpleString::~SimpleString(&local_28);
  }
  return;
}

Assistant:

static int countingMethod_()
{
    return countInCountingMethod++;
}